

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree_data.c
# Opt level: O1

void lyd_wd_update_parents(lyd_node *node)

{
  lys_node *plVar1;
  long lVar2;
  lyd_node *plVar3;
  lyd_node *plVar4;
  
  plVar4 = node->parent;
  if (node->parent != (lyd_node *)0x0) {
    while (((plVar3 = plVar4, (plVar3->field_0x9 & 1) == 0 &&
            (plVar1 = plVar3->schema, plVar1->nodetype == LYS_CONTAINER)) &&
           (lVar2._0_2_ = plVar1[1].flags, lVar2._2_1_ = plVar1[1].ext_size,
           lVar2._3_1_ = plVar1[1].iffeature_size, lVar2._4_1_ = plVar1[1].padding[0],
           lVar2._5_1_ = plVar1[1].padding[1], lVar2._6_1_ = plVar1[1].padding[2],
           lVar2._7_1_ = plVar1[1].padding[3], lVar2 == 0))) {
      for (plVar4 = node->prev; plVar4 != node; plVar4 = plVar4->prev) {
        if ((plVar4->field_0x9 & 1) == 0) {
          if (plVar4 != node) {
            return;
          }
          break;
        }
      }
      if (node->prev == node) {
        return;
      }
      plVar3->field_0x9 = plVar3->field_0x9 | 1;
      plVar4 = plVar3->parent;
      node = plVar3;
      if (plVar3->parent == (lyd_node *)0x0) {
        return;
      }
    }
  }
  return;
}

Assistant:

static void
lyd_wd_update_parents(struct lyd_node *node)
{
    struct lyd_node *parent = node->parent, *iter;

    for (parent = node->parent; parent; parent = node->parent) {
        if (parent->dflt || parent->schema->nodetype != LYS_CONTAINER ||
                ((struct lys_node_container *)parent->schema)->presence) {
            /* parent is already default and there is nothing to update or
             * it is not a non-presence container -> stop the loop */
            break;
        }
        /* check that there is still some non default sibling */
        for (iter = node->prev; iter != node; iter = iter->prev) {
            if (!iter->dflt) {
                break;
            }
        }
        if (iter == node && node->prev != node) {
            /* all siblings are implicit default nodes, propagate it to the parent */
            node = node->parent;
            node->dflt = 1;
            continue;
        } else {
            /* stop the loop */
            break;
        }
    }
}